

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 sqlite3BtreeRowCountEst(BtCursor *pCur)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0xffffffffffffffff;
  if ((pCur->eState == '\0') && (pCur->pPage->leaf != '\0')) {
    uVar2 = (ulong)pCur->pPage->nCell;
    bVar1 = pCur->iPage;
    uVar3 = 0;
    if ((char)bVar1 < '\x01') {
      bVar1 = 0;
    }
    for (; bVar1 != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = uVar2 * pCur->apPage[uVar3]->nCell;
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3BtreeRowCountEst(BtCursor *pCur){
  i64 n;
  u8 i;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );

  /* Currently this interface is only called by the OP_IfSmaller
  ** opcode, and it that case the cursor will always be valid and
  ** will always point to a leaf node. */
  if( NEVER(pCur->eState!=CURSOR_VALID) ) return -1;
  if( NEVER(pCur->pPage->leaf==0) ) return -1;

  n = pCur->pPage->nCell;
  for(i=0; i<pCur->iPage; i++){
    n *= pCur->apPage[i]->nCell;
  }
  return n;
}